

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_error.cpp
# Opt level: O1

void __thiscall pfederc::Parser::sanityExpect(Parser *this,TokenType type)

{
  bool bVar1;
  string local_30;
  
  bVar1 = Token::operator!=(this->lexer->currentToken,type);
  if (bVar1) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unexpected token","");
    fatal("syntax_error.cpp",6,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  Lexer::next(this->lexer);
  return;
}

Assistant:

void Parser::sanityExpect(TokenType type) noexcept {
  if (*lexer.getCurrentToken() != type) {
    fatal("syntax_error.cpp", __LINE__, "Unexpected token");
    return;
  }

  lexer.next();
}